

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O1

void print_rel(wchar_t c,uint8_t a,wchar_t y,wchar_t x)

{
  term_conflict *t;
  ulong uVar1;
  ulong uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  chunk_conflict *pcVar5;
  int iVar6;
  wchar_t wVar7;
  wchar_t a_00;
  undefined7 in_register_00000031;
  int iVar8;
  wchar_t wVar9;
  int iVar10;
  uint uVar11;
  wchar_t j;
  long lVar12;
  wchar_t map_height;
  wchar_t map_width;
  
  a_00 = (wchar_t)CONCAT71(in_register_00000031,a);
  lVar12 = 0;
  do {
    pcVar5 = cave;
    uVar4 = tile_width;
    uVar3 = tile_height;
    t = (term_conflict *)angband_term[lVar12];
    if ((t != (term_conflict *)0x0) && ((window_flag[lVar12] & 0xa0) != 0)) {
      if ((window_flag[lVar12] & 0x20) == 0) {
        wVar7 = y - t->offset_y;
        if ((tile_height < 2) || (wVar7 = wVar7 * (uint)tile_height, wVar7 + L'\x01' < t->hgt)) {
          wVar9 = x - t->offset_x;
          if ((tile_width < 2) || (wVar9 = wVar9 * (uint)tile_width, wVar9 + L'\x01' < t->wid))
          goto LAB_001f494b;
        }
      }
      else {
        wVar7 = (wchar_t)tile_width;
        uVar11 = (uint)tile_height;
        get_minimap_dimensions(t,(chunk *)cave,wVar7,(uint)tile_height,&map_width,&map_height);
        uVar1 = (long)(map_width * x) / (long)pcVar5->width;
        iVar10 = (int)uVar1;
        uVar2 = (long)(map_height * y) / (long)pcVar5->height;
        iVar8 = (int)uVar2;
        if (1 < uVar4) {
          iVar10 = iVar10 - (int)((long)((ulong)(uint)(iVar10 >> 0x1f) << 0x20 | uVar1 & 0xffffffff)
                                 % (long)wVar7);
        }
        if (1 < uVar3) {
          iVar8 = iVar8 - (int)((long)((ulong)(uint)(iVar8 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) %
                               (long)(int)uVar11);
        }
        wVar9 = iVar10 + L'\x01';
        wVar7 = iVar8 + L'\x01';
LAB_001f494b:
        if (((((L'\xffffffff' < wVar7) && (wVar7 < t->hgt)) && (L'\xffffffff' < wVar9)) &&
            (wVar9 < t->wid)) &&
           ((Term_queue_char((term *)t,wVar9,wVar7,a_00,c,L'\0',L'\0'), 1 < tile_width ||
            (1 < tile_height)))) {
          iVar8 = 0;
          if ((window_flag[lVar12] & 0x80) == 0) {
            iVar8 = row_bottom_map[Term->sidebar_mode];
          }
          Term_big_queue_char((term *)t,wVar9,wVar7,t->hgt - iVar8,a_00,c,L'\0',L'\0');
        }
      }
    }
    lVar12 = lVar12 + 1;
    if (lVar12 == 8) {
      iVar8 = y - Term->offset_y;
      if (-1 < iVar8) {
        iVar10 = Term->sidebar_mode;
        if ((iVar8 < (Term->hgt - (row_bottom_map[iVar10] + row_top_map[iVar10])) /
                     (int)(uint)tile_height) && (iVar6 = x - Term->offset_x, -1 < iVar6)) {
          if (iVar6 < (~col_map[iVar10] + Term->wid) / (int)(uint)tile_width) {
            wVar7 = iVar6 * (uint)tile_width + col_map[iVar10];
            wVar9 = iVar8 * (uint)tile_height + row_top_map[iVar10];
            Term_queue_char(Term,wVar7,wVar9,a_00,c,L'\0',L'\0');
            if ((1 < tile_width) || (1 < tile_height)) {
              Term_big_queue_char(Term,wVar7,wVar9,Term->hgt - row_bottom_map[Term->sidebar_mode],
                                  a_00,c,L'\0',L'\0');
            }
          }
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void print_rel(wchar_t c, uint8_t a, int y, int x)
{
	int ky, kx;
	int vy, vx;

	/* Print on map sub-windows */
	print_rel_map(c, a, y, x);

	/* Location relative to panel */
	ky = y - Term->offset_y;

	/* Verify location */
	if ((ky < 0) || (ky >= SCREEN_HGT)) return;

	/* Location relative to panel */
	kx = x - Term->offset_x;

	/* Verify location */
	if ((kx < 0) || (kx >= SCREEN_WID)) return;

	/* Get right position */
	vx = COL_MAP + (tile_width * kx);
	vy = ROW_MAP + (tile_height * ky);

	/* Hack -- Queue it */
	Term_queue_char(Term, vx, vy, a, c, 0, 0);

	if ((tile_width > 1) || (tile_height > 1))
		Term_big_queue_char(Term, vx, vy, ROW_MAP + SCREEN_ROWS,
			a, c, 0, 0);
  
}